

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QRegularExpressionMatchIterator __thiscall
QRegularExpression::globalMatch
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QRegularExpressionPrivate *this_00;
  MatchOptions in_R9D;
  long in_FS_OFFSET;
  QRegularExpressionMatch local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRegularExpressionPrivate *)operator_new(0x20);
  match((QRegularExpression *)&local_40,subject,offset,matchType,matchOptions);
  QRegularExpressionMatchIteratorPrivate::QRegularExpressionMatchIteratorPrivate
            ((QRegularExpressionMatchIteratorPrivate *)this_00,(QRegularExpression *)subject,
             (MatchType)
             matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
             super_QFlagsStorage<QRegularExpression::MatchOption>.i,in_R9D,&local_40);
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
            (&local_40.d);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatchIterator QRegularExpression::globalMatch(const QString &subject,
                                                                qsizetype offset,
                                                                MatchType matchType,
                                                                MatchOptions matchOptions) const
{
    QRegularExpressionMatchIteratorPrivate *priv =
            new QRegularExpressionMatchIteratorPrivate(*this,
                                                       matchType,
                                                       matchOptions,
                                                       match(subject, offset, matchType, matchOptions));

    return QRegularExpressionMatchIterator(*priv);
}